

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::testShader
               (NegativeTestContext *ctx,ImageOperation function,MemoryQualifier memory,
               TextureType imageType,TextureFormat *format)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  char *__rhs;
  RenderContext *renderCtx;
  ProgramSources *sources;
  ShaderInfo *pSVar3;
  MessageBuilder *this;
  ImageOperation function_00;
  MemoryQualifier memory_00;
  TextureFormat *format_00;
  NegativeTestContext *in_stack_fffffffffffffaa8;
  allocator<char> local_4f9;
  string local_4f8;
  MessageBuilder local_4d8;
  ShaderSource local_358;
  ProgramSources local_330;
  undefined1 local_260 [8];
  ShaderProgram program;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  int local_124;
  undefined1 local_120 [4];
  int ndx;
  string local_100;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  TestLog *local_30;
  TestLog *log;
  TextureFormat *format_local;
  MemoryQualifier local_18;
  TextureType imageType_local;
  MemoryQualifier memory_local;
  ImageOperation function_local;
  NegativeTestContext *ctx_local;
  
  log = (TestLog *)format;
  format_local._4_4_ = imageType;
  local_18 = memory;
  imageType_local = function;
  _memory_local = ctx;
  local_30 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  pNVar1 = _memory_local;
  NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_
            (&local_d0,(_anonymous_namespace_ *)(ulong)imageType_local,function_00);
  std::operator+(&local_b0,&local_d0," ");
  NegativeTestShared::(anonymous_namespace)::getMemoryQualifier_abi_cxx11_
            (&local_100,(_anonymous_namespace_ *)(ulong)local_18,memory_00);
  std::operator+(&local_90,&local_b0,&local_100);
  std::operator+(&local_70,&local_90," ");
  NegativeTestShared::(anonymous_namespace)::getShaderImageLayoutQualifier_abi_cxx11_
            ((string *)local_120,(_anonymous_namespace_ *)log,format_00);
  std::operator+(&local_50,&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  NegativeTestContext::beginSection(pNVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  for (local_124 = 0; local_124 < 6; local_124 = local_124 + 1) {
    bVar2 = NegativeTestContext::isShaderSupported
                      (_memory_local,
                       *(ShaderType *)
                        (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_124 * 4)
                      );
    pNVar1 = _memory_local;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"Verify shader: ",
                 (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
      __rhs = glu::getShaderTypeName
                        (*(ShaderType *)
                          (NegativeTestShared::(anonymous_namespace)::s_shaders +
                          (long)local_124 * 4));
      std::operator+(&local_148,&local_168,__rhs);
      NegativeTestContext::beginSection(pNVar1,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf))
      ;
      NegativeTestShared::(anonymous_namespace)::generateShaderSource_abi_cxx11_
                ((string *)&program.m_program.m_info.linkTimeUs,
                 (_anonymous_namespace_ *)(ulong)imageType_local,local_18,format_local._4_4_,
                 (TextureType)log,
                 (TextureFormat *)
                 (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_124 * 4),(ShaderType)in_stack_fffffffffffffaa8);
      renderCtx = NegativeTestContext::getRenderContext(_memory_local);
      glu::ProgramSources::ProgramSources(&local_330);
      glu::ShaderSource::ShaderSource
                (&local_358,
                 *(ShaderType *)
                  (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_124 * 4),
                 (string *)&program.m_program.m_info.linkTimeUs);
      sources = glu::ProgramSources::operator<<(&local_330,&local_358);
      glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_260,renderCtx,sources);
      glu::ShaderSource::~ShaderSource(&local_358);
      glu::ProgramSources::~ProgramSources(&local_330);
      pSVar3 = glu::ShaderProgram::getShaderInfo
                         ((ShaderProgram *)local_260,
                          *(ShaderType *)
                           (NegativeTestShared::(anonymous_namespace)::s_shaders +
                           (long)local_124 * 4),0);
      if ((pSVar3->compileOk & 1U) != 0) {
        glu::operator<<(local_30,(ShaderProgram *)local_260);
        tcu::TestLog::operator<<(&local_4d8,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
        this = tcu::MessageBuilder::operator<<
                         (&local_4d8,
                          (char (*) [50])"Expected program to fail, but compilation passed.");
        tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4d8);
        in_stack_fffffffffffffaa8 = _memory_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f8,"Shader was not expected to compile.",&local_4f9);
        NegativeTestContext::fail(in_stack_fffffffffffffaa8,&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::allocator<char>::~allocator(&local_4f9);
      }
      NegativeTestContext::endSection(_memory_local);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_260);
      std::__cxx11::string::~string((string *)&program.m_program.m_info.linkTimeUs);
    }
  }
  NegativeTestContext::endSection(_memory_local);
  return;
}

Assistant:

void testShader (NegativeTestContext& ctx, ImageOperation function, MemoryQualifier memory, glu::TextureTestUtil::TextureType imageType, const tcu::TextureFormat& format)
{
	tcu::TestLog& log = ctx.getLog();
	ctx.beginSection(getFunctionName(function) + " " + getMemoryQualifier(memory) + " " + getShaderImageLayoutQualifier(format));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaders); ndx++)
	{
		if (ctx.isShaderSupported(s_shaders[ndx]))
		{
			ctx.beginSection(std::string("Verify shader: ") + glu::getShaderTypeName(s_shaders[ndx]));
			std::string					shaderSource(generateShaderSource(function, memory, imageType, format, s_shaders[ndx]));
			const glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(s_shaders[ndx], shaderSource));
			if (program.getShaderInfo(s_shaders[ndx]).compileOk)
			{
				log << program;
				log << tcu::TestLog::Message << "Expected program to fail, but compilation passed." << tcu::TestLog::EndMessage;
				ctx.fail("Shader was not expected to compile.");
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}